

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.h
# Opt level: O2

ostream * __thiscall
testinator::
stringifier_select<std::tuple<int>,_testinator::default_formatter,_testinator::detail::is_tuple_tag>
::output(stringifier_select<std::tuple<int>,_testinator::default_formatter,_testinator::detail::is_tuple_tag>
         *this,ostream *s)

{
  ostream *poVar1;
  
  ::std::operator<<((ostream *)s,"(");
  detail::
  for_each_in_tuple<testinator::stringifier_select<std::tuple<int>,testinator::default_formatter,testinator::detail::is_tuple_tag>::output(std::ostream&)const::_lambda(auto:1&&,unsigned_long)_1_,int,0ul>
            (this->m_t,s,this);
  poVar1 = ::std::operator<<((ostream *)s,")");
  return (ostream *)poVar1;
}

Assistant:

std::ostream& output(std::ostream& s) const
  {
    s << m_f.opener(m_t);
    detail::for_each_in_tuple(m_t,
                              [&s, this] (auto&& e, size_t i)
                              { if (i > 0) s << m_f.separator(m_t);
                                s << prettyprint(std::forward<decltype(e)>(e)); });
    return s << m_f.closer(m_t);
  }